

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.cpp
# Opt level: O2

MultiIndexSet *
TasGrid::MultiIndexManipulations::selectFlaggedChildren
          (MultiIndexSet *__return_storage_ptr__,MultiIndexSet *mset,
          vector<bool,_std::allocator<bool>_> *flagged,
          vector<int,_std::allocator<int>_> *level_limits)

{
  uint uVar1;
  int iVar2;
  unsigned_long new_stride;
  pointer piVar3;
  MultiIndexSet *pMVar4;
  const_reference cVar5;
  bool bVar6;
  int i;
  size_type sVar7;
  int *k;
  pointer piVar8;
  int *k_1;
  int *piVar9;
  int *piVar10;
  vector<int,_std::allocator<int>_> kid;
  unsigned_long __n2;
  Data2D<int> children_unsorted;
  allocator_type local_a1;
  _Vector_base<int,_std::allocator<int>_> local_a0;
  size_t local_88;
  unsigned_long local_80;
  MultiIndexSet *local_78;
  vector<bool,_std::allocator<bool>_> *local_70;
  size_type local_68;
  vector<int,_std::allocator<int>_> *local_60;
  Data2D<int> local_58;
  
  new_stride = mset->num_dimensions;
  uVar1 = mset->cache_num_indexes;
  sVar7 = 0;
  local_70 = flagged;
  Data2D<int>::Data2D<unsigned_long,int>(&local_58,new_stride,0);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_a0,new_stride,&local_a1);
  local_88 = new_stride * 4;
  if (0 < (int)uVar1) {
    sVar7 = (size_type)uVar1;
  }
  local_80 = new_stride;
  local_78 = __return_storage_ptr__;
  local_68 = sVar7;
  if ((level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    for (sVar7 = 0; sVar7 != local_68; sVar7 = sVar7 + 1) {
      cVar5 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_70,sVar7);
      if (cVar5) {
        piVar10 = local_a0._M_impl.super__Vector_impl_data._M_start;
        piVar9 = local_a0._M_impl.super__Vector_impl_data._M_finish;
        if (local_80 != 0) {
          memmove(local_a0._M_impl.super__Vector_impl_data._M_start,
                  (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + mset->num_dimensions * sVar7,local_88);
          piVar10 = local_a0._M_impl.super__Vector_impl_data._M_start;
          piVar9 = local_a0._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; piVar10 != piVar9; piVar10 = piVar10 + 1) {
          *piVar10 = *piVar10 + 1;
          bVar6 = MultiIndexSet::missing(mset,(vector<int,_std::allocator<int>_> *)&local_a0);
          if (bVar6) {
            Data2D<int>::appendStrip(&local_58,(vector<int,_std::allocator<int>_> *)&local_a0);
          }
          *piVar10 = *piVar10 + -1;
        }
      }
    }
  }
  else {
    local_60 = level_limits;
    for (sVar7 = 0; sVar7 != local_68; sVar7 = sVar7 + 1) {
      cVar5 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_70,sVar7);
      if (cVar5) {
        if (local_80 != 0) {
          memmove(local_a0._M_impl.super__Vector_impl_data._M_start,
                  (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + mset->num_dimensions * sVar7,local_88);
        }
        piVar3 = local_a0._M_impl.super__Vector_impl_data._M_finish;
        piVar9 = (local_60->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (piVar8 = local_a0._M_impl.super__Vector_impl_data._M_start; piVar8 != piVar3;
            piVar8 = piVar8 + 1) {
          iVar2 = *piVar8;
          *piVar8 = iVar2 + 1;
          if ((*piVar9 == -1 || iVar2 < *piVar9) &&
             (bVar6 = MultiIndexSet::missing(mset,(vector<int,_std::allocator<int>_> *)&local_a0),
             bVar6)) {
            Data2D<int>::appendStrip(&local_58,(vector<int,_std::allocator<int>_> *)&local_a0);
          }
          *piVar8 = *piVar8 + -1;
          piVar9 = piVar9 + 1;
        }
      }
    }
  }
  pMVar4 = local_78;
  MultiIndexSet::MultiIndexSet(local_78,&local_58);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a0);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_58.vec.super__Vector_base<int,_std::allocator<int>_>);
  return pMVar4;
}

Assistant:

MultiIndexSet selectFlaggedChildren(const MultiIndexSet &mset, const std::vector<bool> &flagged, const std::vector<int> &level_limits){
    size_t num_dimensions = mset.getNumDimensions();
    int n = mset.getNumIndexes();

    Data2D<int> children_unsorted(num_dimensions, 0);

    #ifdef _OPENMP
    #pragma omp parallel
    {
        Data2D<int> lrefined(num_dimensions, 0);
        std::vector<int> kid(num_dimensions);

        if (level_limits.empty()){
            #pragma omp for
            for(int i=0; i<n; i++){
                if (flagged[i]){
                    std::copy_n(mset.getIndex(i), num_dimensions, kid.data());
                    for(auto &k : kid){
                        k++;
                        if (mset.missing(kid)) lrefined.appendStrip(kid);
                        k--;
                    }
                }
            }
        }else{
            #pragma omp for
            for(int i=0; i<n; i++){
                if (flagged[i]){
                    std::copy_n(mset.getIndex(i), num_dimensions, kid.data());
                    auto ill = level_limits.begin();
                    for(auto &k : kid){
                        k++;
                        if (((*ill == -1) || (k <= *ill)) && mset.missing(kid))
                            lrefined.appendStrip(kid);
                        k--;
                        ill++;
                    }
                }
            }
        }

        #pragma omp critical
        {
            children_unsorted.append(lrefined);
        }
    }
    #else
    std::vector<int> kid(num_dimensions);

    if (level_limits.empty()){
        for(int i=0; i<n; i++){
            if (flagged[i]){
                std::copy_n(mset.getIndex(i), num_dimensions, kid.data());
                for(auto &k : kid){
                    k++;
                    if (mset.missing(kid)) children_unsorted.appendStrip(kid);
                    k--;
                }
            }
        }
    }else{
        for(int i=0; i<n; i++){
            if (flagged[i]){
                std::copy_n(mset.getIndex(i), num_dimensions, kid.data());
                auto ill = level_limits.begin();
                for(auto &k : kid){
                    k++;
                    if (((*ill == -1) || (k <= *ill)) && mset.missing(kid))
                        children_unsorted.appendStrip(kid);
                    k--;
                    ill++;
                }
            }
        }
    }
    #endif

    return MultiIndexSet(children_unsorted);
}